

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hu_scores.cpp
# Opt level: O3

int HU_GetRowColor(player_t *player,bool highlight)

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  undefined8 *puVar4;
  FIntCVar *pFVar5;
  FIntCVar *pFVar6;
  
  if (deathmatch.Value == 0 || !teamplay.Value) {
    if (highlight) {
      pFVar5 = &sb_cooperative_yourplayercolor;
      pFVar6 = &sb_deathmatch_yourplayercolor;
    }
    else {
      if ((demoplayback) && ((player_t *)(&players + (long)consoleplayer * 0x54) == player)) {
        return 5;
      }
      pFVar5 = &sb_cooperative_otherplayercolor;
      pFVar6 = &sb_deathmatch_otherplayercolor;
    }
    if (deathmatch.Value == 0) {
      pFVar6 = pFVar5;
    }
    iVar3 = pFVar6->Value;
  }
  else {
    puVar1 = (undefined8 *)
             ((long)&((player->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                     .Nodes)->Next +
             (ulong)(((player->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                      .Size - 1 & 0x1e5) * 0x18));
    do {
      puVar4 = puVar1;
      puVar1 = (undefined8 *)*puVar4;
    } while (*(int *)(puVar4 + 1) != 0x1e5);
    bVar2 = FTeam::IsValidTeam(&TeamLibrary,*(uint *)(puVar4[2] + 0x28));
    iVar3 = 2;
    if (bVar2) {
      puVar1 = (undefined8 *)
               ((long)&((player->userinfo).
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                       .Nodes)->Next +
               (ulong)(((player->userinfo).
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                        .Size - 1 & 0x1e5) * 0x18));
      do {
        puVar4 = puVar1;
        puVar1 = (undefined8 *)*puVar4;
      } while (*(int *)(puVar4 + 1) != 0x1e5);
      iVar3 = FTeam::GetTextColor(Teams.Array + *(int *)(puVar4[2] + 0x28));
      return iVar3;
    }
  }
  return iVar3;
}

Assistant:

int HU_GetRowColor(player_t *player, bool highlight)
{
	if (teamplay && deathmatch)
	{
		if (TeamLibrary.IsValidTeam (player->userinfo.GetTeam()))
			return Teams[player->userinfo.GetTeam()].GetTextColor();
		else
			return CR_GREY;
	}
	else
	{
		if (!highlight)
		{
			if (demoplayback && player == &players[consoleplayer])
			{
				return CR_GOLD;
			}
			else
			{
				return deathmatch ? sb_deathmatch_otherplayercolor : sb_cooperative_otherplayercolor;
			}
		}
		else
		{
			return deathmatch ? sb_deathmatch_yourplayercolor : sb_cooperative_yourplayercolor;
		}
	}
}